

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall
helics::FederateState::logMessage
          (FederateState *this,int level,string_view logMessageSource,string_view message,
          bool fromRemote)

{
  string_view message_00;
  string_view header_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  bool bVar1;
  const_reference pvVar2;
  char *in_RDX;
  int in_ESI;
  FederateState *in_RDI;
  char *in_R8;
  size_t in_R9;
  undefined1 in_stack_00000008;
  string timeString;
  Time currentTime;
  string header;
  undefined4 in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  undefined1 local_340 [32];
  GlobalFederateId local_320;
  BaseType local_31c;
  char *local_318;
  undefined8 local_310;
  undefined1 local_308 [32];
  baseType local_2e8;
  double local_2e0;
  char *local_2d8;
  undefined8 local_2d0;
  undefined1 local_2c8 [32];
  TimeRepresentation<count_time<9,_long>_> local_2a8;
  char *local_2a0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_298;
  char local_290 [32];
  undefined1 local_270 [48];
  TimeRepresentation<count_time<9,_long>_> local_240 [4];
  undefined1 in_stack_fffffffffffffde3;
  int in_stack_fffffffffffffde4;
  undefined3 in_stack_fffffffffffffde8;
  uint uVar3;
  FederateState *pFVar4;
  double local_1e8 [2];
  undefined8 local_1d8;
  double *local_1d0;
  char *local_1c8;
  undefined8 uStack_1c0;
  double *local_1b8;
  char *local_1b0;
  undefined8 uStack_1a8;
  undefined1 *local_1a0;
  undefined1 local_198 [16];
  undefined8 local_188;
  undefined1 *local_180;
  char *local_178;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aStack_170;
  string *local_168;
  char *in_stack_fffffffffffffea0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  size_t in_stack_fffffffffffffeb8;
  BaseType local_138 [8];
  undefined8 local_118;
  undefined1 *local_110;
  char *local_108;
  undefined8 uStack_100;
  undefined1 *local_f8;
  BaseType *local_f0;
  char *local_e0;
  undefined8 uStack_d8;
  undefined1 *local_d0;
  undefined1 local_c8 [32];
  undefined8 local_a8;
  undefined1 *local_a0;
  char *local_98;
  undefined8 uStack_90;
  undefined1 *local_88;
  undefined1 *local_80;
  char *local_78;
  undefined8 uStack_70;
  undefined1 *local_68;
  BaseType local_5c;
  BaseType *local_58;
  double local_50;
  double *local_48;
  double *local_40;
  undefined8 *local_38;
  undefined1 *local_30;
  undefined8 *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  uVar3 = CONCAT13(in_stack_00000008,in_stack_fffffffffffffde8) & 0x1ffffff;
  if ((in_ESI <= in_RDI->maxLogLevel) || ((char)(uVar3 >> 0x18) != '\0')) {
    pFVar4 = in_RDI;
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    local_240[0].internalTimeCode = (baseType)grantedTime(in_RDI);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                      (local_240,(TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
    if (bVar1) {
      local_2a0 = "[{}]";
      local_298 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)0x4;
      getState((FederateState *)0x58b0ab);
      local_168 = fedStateString_abi_cxx11_
                            ((FederateStates)((ulong)in_stack_fffffffffffffc88 >> 0x38));
      in_stack_fffffffffffffeb0 = local_290;
      local_178 = local_2a0;
      aStack_170.args_ = local_298.args_;
      in_stack_fffffffffffffea0 = local_2a0;
      in_stack_fffffffffffffea8 = local_298;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                ((value<fmt::v11::context> *)
                 CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 in_stack_fffffffffffffc48);
      local_28 = &local_188;
      local_30 = local_198;
      local_188 = 0xd;
      fmt.size_ = in_stack_fffffffffffffeb8;
      fmt.data_ = in_stack_fffffffffffffeb0;
      args.field_1.args_ = in_stack_fffffffffffffea8.args_;
      args.desc_ = (unsigned_long_long)in_stack_fffffffffffffea0;
      local_180 = local_30;
      ::fmt::v11::vformat_abi_cxx11_(fmt,args);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      std::__cxx11::string::~string(in_stack_fffffffffffffc40);
    }
    else {
      local_2a8 = TimeRepresentation<count_time<9,_long>_>::maxVal();
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==(local_240,&local_2a8);
      if (bVar1) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(in_stack_fffffffffffffc40,
                  (char *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      }
      else {
        local_2d8 = "[{}]";
        local_2d0 = 4;
        local_2e8 = (baseType)grantedTime(in_RDI);
        local_2e0 = TimeRepresentation::operator_cast_to_double
                              ((TimeRepresentation<count_time<9,_long>_> *)0x58b279);
        local_1a0 = local_2c8;
        local_1b0 = local_2d8;
        uStack_1a8 = local_2d0;
        local_1b8 = &local_2e0;
        local_1c8 = local_2d8;
        uStack_1c0 = local_2d0;
        local_48 = local_1e8;
        local_38 = &local_1d8;
        local_1d8 = 10;
        fmt_00.size_ = in_stack_fffffffffffffeb8;
        fmt_00.data_ = in_stack_fffffffffffffeb0;
        args_00.field_1.args_ = in_stack_fffffffffffffea8.args_;
        args_00.desc_ = (unsigned_long_long)in_stack_fffffffffffffea0;
        local_50 = local_2e0;
        local_40 = local_48;
        local_1e8[0] = local_2e0;
        local_1d0 = local_48;
        ::fmt::v11::vformat_abi_cxx11_(fmt_00,args_00);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        std::__cxx11::string::~string(in_stack_fffffffffffffc40);
      }
    }
    bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffe08)
    ;
    if (bVar1) {
      local_318 = "{} ({}){}";
      local_310 = 9;
      local_320 = std::atomic<helics::GlobalFederateId>::load(&in_RDI->global_id,seq_cst);
      local_31c = GlobalFederateId::baseValue(&local_320);
      local_d0 = local_308;
      local_e0 = local_318;
      uStack_d8 = local_310;
      local_f0 = &local_31c;
      local_f8 = local_270;
      local_108 = local_318;
      uStack_100 = local_310;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                ((value<fmt::v11::context> *)
                 CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 in_stack_fffffffffffffc48);
      local_58 = local_138;
      local_5c = *local_f0;
      local_138[0] = local_5c;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                ((value<fmt::v11::context> *)
                 CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 in_stack_fffffffffffffc48);
      local_8 = &local_118;
      local_10 = &stack0xfffffffffffffeb8;
      local_118 = 0xd1d;
      fmt_01.size_ = in_stack_fffffffffffffeb8;
      fmt_01.data_ = in_stack_fffffffffffffeb0;
      args_01.field_1.args_ = in_stack_fffffffffffffea8.args_;
      args_01.desc_ = (unsigned_long_long)in_stack_fffffffffffffea0;
      local_110 = local_10;
      ::fmt::v11::vformat_abi_cxx11_(fmt_01,args_01);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      std::__cxx11::string::~string(in_stack_fffffffffffffc40);
    }
    else {
      pvVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::back
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          &stack0xfffffffffffffe08);
      if (*pvVar2 == ']') {
        std::__cxx11::string::operator=
                  (in_stack_fffffffffffffc40,
                   (basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      }
      else {
        local_68 = local_340;
        local_78 = "{}{}";
        uStack_70 = 4;
        local_80 = &stack0xfffffffffffffe08;
        local_88 = local_270;
        local_98 = "{}{}";
        uStack_90 = 4;
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)
                   CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                   (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc48);
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)
                   CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                   in_stack_fffffffffffffc48);
        local_18 = &local_a8;
        local_20 = local_c8;
        local_a8 = 0xdd;
        fmt_02.size_ = in_stack_fffffffffffffeb8;
        fmt_02.data_ = in_stack_fffffffffffffeb0;
        args_02.field_1.args_ = in_stack_fffffffffffffea8.args_;
        args_02.desc_ = (unsigned_long_long)in_stack_fffffffffffffea0;
        local_a0 = local_20;
        ::fmt::v11::vformat_abi_cxx11_(fmt_02,args_02);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        std::__cxx11::string::~string(in_stack_fffffffffffffc40);
      }
    }
    std::unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>::operator->
              ((unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_> *)0x58b6d2)
    ;
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc40);
    header_00._M_str = in_RDX;
    header_00._M_len = in_R9;
    message_00._M_str = in_R8;
    message_00._M_len = (size_t)pFVar4;
    LogManager::sendToLogger
              ((LogManager *)CONCAT44(in_ESI,uVar3),in_stack_fffffffffffffde4,header_00,message_00,
               (bool)in_stack_fffffffffffffde3);
    std::__cxx11::string::~string(in_stack_fffffffffffffc40);
    std::__cxx11::string::~string(in_stack_fffffffffffffc40);
  }
  return;
}

Assistant:

void FederateState::logMessage(int level,
                               std::string_view logMessageSource,
                               std::string_view message,
                               bool fromRemote) const
{
    if (level > maxLogLevel && !fromRemote) {
        return;
    }
    std::string header;
    auto currentTime = grantedTime();
    std::string timeString;
    if (currentTime < timeZero) {
        timeString = fmt::format("[{}]", fedStateString(getState()));
    } else if (currentTime == Time::maxVal()) {
        timeString = "[MAXTIME]";
    } else {
        timeString = fmt::format("[{}]", static_cast<double>(grantedTime()));
    }
    if (logMessageSource.empty()) {
        header = fmt::format("{} ({}){}", name, global_id.load().baseValue(), timeString);
    } else if (logMessageSource.back() == ']') {
        header = logMessageSource;
    } else {
        header = fmt::format("{}{}", logMessageSource, timeString);
    }

    mLogManager->sendToLogger(level, header, message, fromRemote);
}